

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericDatum.hh
# Opt level: O2

GenericEnum * __thiscall avro::GenericEnum::operator=(GenericEnum *this,GenericEnum *param_1)

{
  boost::shared_ptr<avro::Node>::operator=
            ((shared_ptr<avro::Node> *)this,(shared_ptr<avro::Node> *)param_1);
  this->value_ = param_1->value_;
  return this;
}

Assistant:

class AVRO_DECL GenericEnum : public GenericContainer {
    size_t value_;

    static size_t index(const NodePtr& schema, const std::string& symbol) {
        size_t result;
        if (schema->nameIndex(symbol, result)) {
            return result;
        }
        throw Exception("No such symbol");
    }

public:
    /**
     * Constructs a generic enum corresponding to the given schema \p schema,
     * which should be of Avro type enum.
     */
    GenericEnum(const NodePtr& schema) :
        GenericContainer(AVRO_ENUM, schema), value_(0) {
    }

    GenericEnum(const NodePtr& schema, const std::string& symbol) :
        GenericContainer(AVRO_ENUM, schema), value_(index(schema, symbol)) {
    }

    /**
     * Returns the symbol corresponding to the cardinal \p n. If the
     * value for \p n is not within the limits an exception is thrown.
     */
    const std::string& symbol(size_t n) {
        if (n < schema()->names()) {
            return schema()->nameAt(n);
        }
        throw Exception("Not as many symbols");
    }

    /**
     * Returns the cardinal for the given symbol \c symbol. If the symbol
     * is not defined for this enum and exception is thrown.
     */
    size_t index(const std::string& symbol) const {
        return index(schema(), symbol);
    }

    /**
     * Set the value for this enum corresponding to the given symbol \c symbol.
     */
    size_t set(const std::string& symbol) {
        return value_ = index(symbol);
    }

    /**
     * Set the value for this enum corresponding to the given cardinal \c n.
     */
    void set(size_t n) {
        if (n < schema()->names()) {
            value_ = n;
            return;
        }
        throw Exception("Not as many symbols");
    }

    /**
     * Returns the cardinal for the current value of this enum.
     */
    size_t value() const {
        return value_;
    }

    /**
     * Returns the symbol for the current value of this enum.
     */
    const std::string& symbol() const {
        return schema()->nameAt(value_);
    }
}